

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::BindDirectiveSyntax::BindDirectiveSyntax
          (BindDirectiveSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token bind,NameSyntax *target,BindTargetListSyntax *targetInstances,
          MemberSyntax *instantiation)

{
  NameSyntax *pNVar1;
  MemberSyntax *pMVar2;
  SyntaxNode *in_RCX;
  MemberSyntax *in_RDX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RSI;
  SyntaxNode *in_RDI;
  NameSyntax *in_R8;
  SyntaxNode *in_R9;
  MemberSyntax *in_stack_00000008;
  MemberSyntax *local_40;
  NameSyntax *local_38;
  SyntaxNode *local_30;
  NameSyntax *local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  MemberSyntax::MemberSyntax(in_RDX,(SyntaxKind)((ulong)in_RDI >> 0x20),in_RSI);
  in_RDI[3].parent = &in_RDX->super_SyntaxNode;
  in_RDI[3].previewNode = in_RCX;
  local_38 = local_28;
  not_null<slang::syntax::NameSyntax_*>::not_null<slang::syntax::NameSyntax_*>
            ((not_null<slang::syntax::NameSyntax_*> *)(in_RDI + 4),&local_38);
  in_RDI[4].parent = local_30;
  local_40 = in_stack_00000008;
  not_null<slang::syntax::MemberSyntax_*>::not_null<slang::syntax::MemberSyntax_*>
            ((not_null<slang::syntax::MemberSyntax_*> *)&in_RDI[4].previewNode,&local_40);
  pNVar1 = not_null<slang::syntax::NameSyntax_*>::operator->
                     ((not_null<slang::syntax::NameSyntax_*> *)0x402daf);
  (pNVar1->super_ExpressionSyntax).super_SyntaxNode.parent = in_RDI;
  if (in_RDI[4].parent != (SyntaxNode *)0x0) {
    (in_RDI[4].parent)->parent = in_RDI;
  }
  pMVar2 = not_null<slang::syntax::MemberSyntax_*>::operator->
                     ((not_null<slang::syntax::MemberSyntax_*> *)0x402dda);
  (pMVar2->super_SyntaxNode).parent = in_RDI;
  return;
}

Assistant:

BindDirectiveSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token bind, NameSyntax& target, BindTargetListSyntax* targetInstances, MemberSyntax& instantiation) :
        MemberSyntax(SyntaxKind::BindDirective, attributes), bind(bind), target(&target), targetInstances(targetInstances), instantiation(&instantiation) {
        this->target->parent = this;
        if (this->targetInstances) this->targetInstances->parent = this;
        this->instantiation->parent = this;
    }